

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.c
# Opt level: O3

void fill_MPP_FMT_RGBA8888(RK_U8 *p,RK_U32 R,RK_U32 G,RK_U32 B,RK_U32 be)

{
  RK_U8 RVar1;
  RK_U8 RVar2;
  
  RVar2 = (RK_U8)G;
  RVar1 = (RK_U8)B;
  if (be == 0) {
    RVar2 = (RK_U8)B;
    RVar1 = (RK_U8)G;
  }
  *p = -(be == 0) | (byte)R;
  p[1] = RVar2;
  p[2] = RVar1;
  p[3] = -(be != 0) | (byte)R;
  return;
}

Assistant:

static void fill_MPP_FMT_RGBA8888(RK_U8 *p, RK_U32 R, RK_U32 G, RK_U32 B, RK_U32 be)
{
    // MPP_FMT_RGBA8888
    // 32 bit pixel     MSB  -------->  LSB
    //                 (rrrr,rrrr,gggg,gggg,bbbb,bbbb,XXXX,XXXX)
    // big    endian   |  byte 0 |  byte 1 |  byte 2 |  byte 3 |
    // little endian   |  byte 3 |  byte 2 |  byte 1 |  byte 0 |
    if (be) {
        p[0] = R;
        p[1] = G;
        p[2] = B;
        p[3] = 0xff;
    } else {
        p[0] = 0xff;
        p[1] = B;
        p[2] = G;
        p[3] = R;
    }
}